

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateOneElement(xmlSchemaValidCtxtPtr ctxt,xmlNodePtr elem)

{
  xmlNodePtr elem_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlSchemaValidCtxtPtr)0x0) || (elem == (xmlNodePtr)0x0)) ||
     (elem->type != XML_ELEMENT_NODE)) {
    ctxt_local._4_4_ = -1;
  }
  else if (ctxt->schema == (xmlSchemaPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    ctxt->doc = elem->doc;
    ctxt->node = elem;
    ctxt->validationRoot = elem;
    ctxt_local._4_4_ = xmlSchemaVStart(ctxt);
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlSchemaValidateOneElement(xmlSchemaValidCtxtPtr ctxt, xmlNodePtr elem)
{
    if ((ctxt == NULL) || (elem == NULL) || (elem->type != XML_ELEMENT_NODE))
	return (-1);

    if (ctxt->schema == NULL)
	return (-1);

    ctxt->doc = elem->doc;
    ctxt->node = elem;
    ctxt->validationRoot = elem;
    return(xmlSchemaVStart(ctxt));
}